

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCTest.cpp
# Opt level: O3

Function * RandomFunction(void)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  Function *this;
  String *pSVar8;
  uint uVar9;
  int iVar10;
  
  this = luna::GC::NewFunction(&g_gc,GCGen2);
  pSVar8 = RandomString();
  luna::Function::SetModuleName(this,pSVar8);
  iVar1 = rand();
  luna::Function::SetLine(this,iVar1 % 1000);
  iVar1 = rand();
  if (-10 < iVar1 % 0x3df) {
    iVar10 = 0;
    do {
      uVar2 = rand();
      uVar3 = rand();
      uVar4 = uVar3 + 0x7f;
      if (-1 < (int)uVar3) {
        uVar4 = uVar3;
      }
      uVar5 = rand();
      uVar6 = uVar5 + 0x7f;
      if (-1 < (int)uVar5) {
        uVar6 = uVar5;
      }
      uVar7 = rand();
      uVar9 = uVar7 + 0x7f;
      if (-1 < (int)uVar7) {
        uVar9 = uVar7;
      }
      luna::Function::AddInstruction
                (this,(Instruction)
                      ((uVar7 - (uVar9 & 0x80) & 0xff) +
                       ((uVar5 - (uVar6 & 0x80) & 0xff) << 8 |
                       (uVar3 - (uVar4 & 0x80) & 0xff) << 0x10 | uVar2 % 9 << 0x18) + 0x1000000),
                 iVar10);
      iVar10 = iVar10 + 1;
    } while (iVar1 % 0x3df + 10 != iVar10);
  }
  iVar1 = rand();
  iVar1 = iVar1 % 5;
  if (0 < iVar1) {
    do {
      iVar10 = rand();
      luna::Function::AddConstNumber(this,(double)(iVar10 % 100000));
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  iVar1 = rand();
  iVar1 = iVar1 % 5;
  if (0 < iVar1) {
    do {
      pSVar8 = RandomString();
      luna::Function::AddConstString(this,pSVar8);
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  if (((this->super_GCObject).field_0x10 & 3) != 0) {
    luna::GC::SetBarrier(&g_gc,&this->super_GCObject);
  }
  return this;
}

Assistant:

luna::Function * RandomFunction()
{
    auto f = g_gc.NewFunction();

    auto s = RandomString();
    f->SetModuleName(s);
    f->SetLine(RandomNum(1000));

    int instruction_count = RandomRange(10, 1000);
    for (int i = 0; i < instruction_count; ++i)
    {
        unsigned int op_min = luna::OpType_LoadNil;
        unsigned int op_max = luna::OpType_GetGlobal;
        luna::OpType op = static_cast<luna::OpType>(RandomRange(op_min, op_max));
        luna::Instruction instruction(op, RandomNum(128), RandomNum(128), RandomNum(128));
        f->AddInstruction(instruction, i);
    }

    int const_num = RandomNum(5);
    for (int i = 0; i < const_num; ++i)
        f->AddConstNumber(RandomNum(100000));

    int const_str = RandomNum(5);
    for (int i = 0; i < const_str; ++i)
        f->AddConstString(RandomString());

    CHECK_BARRIER(g_gc, f);

    return f;
}